

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  bool bVar1;
  CppType CVar2;
  Descriptor *pDVar3;
  MessageFactory *pMVar4;
  MessageFactory *pMVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppFVar8;
  Message *pMVar9;
  Message *pMVar10;
  Reflection *this;
  Reflection *in_RSI;
  Reflection *in_RDI;
  int j;
  int count;
  MapFieldBase *to_field;
  MapFieldBase *from_field;
  FieldDescriptor *field;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  bool is_to_generated;
  bool is_from_generated;
  Reflection *to_reflection;
  Reflection *from_reflection;
  Descriptor *descriptor;
  LogMessage *in_stack_fffffffffffffb98;
  Reflection *in_stack_fffffffffffffba0;
  int index;
  FieldDescriptor *in_stack_fffffffffffffba8;
  Reflection *in_stack_fffffffffffffbb0;
  Reflection *in_stack_fffffffffffffbb8;
  Reflection *in_stack_fffffffffffffbc0;
  Reflection *in_stack_fffffffffffffbc8;
  Reflection *in_stack_fffffffffffffbd0;
  Reflection *in_stack_fffffffffffffbd8;
  Reflection *in_stack_fffffffffffffbe0;
  Reflection *in_stack_fffffffffffffbe8;
  Reflection *in_stack_fffffffffffffbf8;
  Reflection *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  Reflection *in_stack_fffffffffffffc10;
  Reflection *in_stack_fffffffffffffc18;
  Reflection *in_stack_fffffffffffffc20;
  Reflection *in_stack_fffffffffffffc28;
  Message *in_stack_fffffffffffffc40;
  string local_140 [32];
  string local_120 [32];
  int local_100;
  int local_fc;
  MapFieldBase *local_f8;
  MapFieldBase *local_f0;
  Reflection *local_e8;
  int local_dc;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  byte local_ba;
  byte local_b9;
  Reflection *local_b8;
  Reflection *local_b0;
  byte local_a1;
  Descriptor *local_68;
  byte local_49;
  Reflection *local_10;
  
  local_49 = 0;
  local_10 = in_RSI;
  if (in_RDI == in_RSI) {
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffbb0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffba8 >> 0x20),
               (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    local_49 = 1;
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x44d004);
  }
  local_68 = Message::GetDescriptor((Message *)in_stack_fffffffffffffba0);
  pDVar3 = Message::GetDescriptor((Message *)in_stack_fffffffffffffba0);
  local_a1 = 0;
  if (pDVar3 != local_68) {
    LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffbb0,
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffba8 >> 0x20),
               (char *)in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    local_a1 = 1;
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    Descriptor::full_name_abi_cxx11_(local_68);
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(string *)in_stack_fffffffffffffb98);
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    pDVar3 = Message::GetDescriptor((Message *)in_stack_fffffffffffffba0);
    Descriptor::full_name_abi_cxx11_(pDVar3);
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(string *)in_stack_fffffffffffffb98);
    LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x44d1b9);
  }
  local_b0 = GetReflectionOrDie(in_stack_fffffffffffffc40);
  local_b8 = GetReflectionOrDie(in_stack_fffffffffffffc40);
  pMVar4 = Reflection::GetMessageFactory(local_b0);
  pMVar5 = MessageFactory::generated_factory();
  local_b9 = pMVar4 == pMVar5;
  pMVar4 = Reflection::GetMessageFactory(local_b8);
  pMVar5 = MessageFactory::generated_factory();
  local_ba = pMVar4 == pMVar5;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x44d258);
  Reflection::ListFields
            (in_stack_fffffffffffffc10,
             (Message *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)in_stack_fffffffffffffc00);
  local_dc = 0;
  do {
    uVar6 = (ulong)local_dc;
    sVar7 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&local_d8);
    if (sVar7 <= uVar6) {
      this = (Reflection *)
             Reflection::MutableUnknownFields
                       (in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
      Reflection::GetUnknownFields(this,(Message *)in_stack_fffffffffffffb98);
      UnknownFieldSet::MergeFrom
                ((UnknownFieldSet *)in_stack_fffffffffffffbb0,
                 (UnknownFieldSet *)in_stack_fffffffffffffba8);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)in_stack_fffffffffffffbb0);
      return;
    }
    ppFVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&local_d8,(long)local_dc);
    local_e8 = (Reflection *)*ppFVar8;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x44d2e0);
    if (bVar1) {
      if (((local_b9 & 1) == (local_ba & 1)) &&
         (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffba0), bVar1)) {
        local_f0 = Reflection::GetMapData
                             (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                              (FieldDescriptor *)in_stack_fffffffffffffba0);
        local_f8 = Reflection::MutableMapData
                             (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                              (FieldDescriptor *)in_stack_fffffffffffffba0);
        bVar1 = MapFieldBase::IsMapValid((MapFieldBase *)in_stack_fffffffffffffba0);
        if ((bVar1) &&
           (bVar1 = MapFieldBase::IsMapValid((MapFieldBase *)in_stack_fffffffffffffba0), bVar1)) {
          (*local_f8->_vptr_MapFieldBase[8])(local_f8,local_f0);
          goto switchD_0044dadb_default;
        }
      }
      local_fc = Reflection::FieldSize
                           (in_stack_fffffffffffffc18,(Message *)in_stack_fffffffffffffc10,
                            (FieldDescriptor *)
                            CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      for (local_100 = 0; local_100 < local_fc; local_100 = local_100 + 1) {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x44d4f9);
        index = (int)((ulong)in_stack_fffffffffffffba0 >> 0x20);
        switch(CVar2) {
        case CPPTYPE_INT32:
          Reflection::GetRepeatedInt32
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddInt32
                    (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                     (FieldDescriptor *)in_stack_fffffffffffffbc0,
                     (int32)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
          break;
        case CPPTYPE_INT64:
          Reflection::GetRepeatedInt64
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddInt64
                    (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                     (FieldDescriptor *)in_stack_fffffffffffffbc0,(int64)in_stack_fffffffffffffbb8);
          break;
        case CPPTYPE_UINT32:
          Reflection::GetRepeatedUInt32
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddUInt32
                    (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                     (FieldDescriptor *)in_stack_fffffffffffffbc0,
                     (uint32)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
          break;
        case CPPTYPE_UINT64:
          Reflection::GetRepeatedUInt64
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddUInt64
                    (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                     (FieldDescriptor *)in_stack_fffffffffffffbc0,(uint64)in_stack_fffffffffffffbb8)
          ;
          break;
        case CPPTYPE_DOUBLE:
          Reflection::GetRepeatedDouble
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddDouble
                    (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                     (FieldDescriptor *)in_stack_fffffffffffffbc0,(double)in_stack_fffffffffffffbb8)
          ;
          break;
        case CPPTYPE_FLOAT:
          Reflection::GetRepeatedFloat
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddFloat
                    (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                     (FieldDescriptor *)in_stack_fffffffffffffbc0,
                     (float)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
          break;
        case CPPTYPE_BOOL:
          Reflection::GetRepeatedBool
                    (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,index);
          Reflection::AddBool(in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                              (FieldDescriptor *)in_stack_fffffffffffffbc0,
                              SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
          break;
        case CPPTYPE_ENUM:
          Reflection::GetRepeatedEnum
                    (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                     (FieldDescriptor *)in_stack_fffffffffffffba0,
                     (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
          Reflection::AddEnum(in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                              (FieldDescriptor *)in_stack_fffffffffffffbc0,
                              (EnumValueDescriptor *)in_stack_fffffffffffffbb8);
          break;
        case CPPTYPE_STRING:
          Reflection::GetRepeatedString_abi_cxx11_
                    (in_stack_fffffffffffffbc8,(Message *)in_stack_fffffffffffffbc0,
                     (FieldDescriptor *)in_stack_fffffffffffffbb8,
                     (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          Reflection::AddString
                    (in_stack_fffffffffffffc10,
                     (Message *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                     (FieldDescriptor *)in_stack_fffffffffffffc00,
                     (string *)in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(local_120);
          break;
        case CPPTYPE_MESSAGE:
          pMVar9 = Reflection::AddMessage
                             (in_stack_fffffffffffffbd8,(Message *)in_stack_fffffffffffffbd0,
                              (FieldDescriptor *)in_stack_fffffffffffffbc8,
                              (MessageFactory *)in_stack_fffffffffffffbc0);
          pMVar10 = Reflection::GetRepeatedMessage
                              (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                               in_stack_fffffffffffffba8,
                               (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
          (*(pMVar9->super_MessageLite)._vptr_MessageLite[0x11])(pMVar9,pMVar10);
        }
      }
    }
    else {
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x44daa0);
      switch(CVar2) {
      case CPPTYPE_INT32:
        Reflection::GetInt32
                  (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffba8);
        Reflection::SetInt32
                  (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                   (FieldDescriptor *)in_stack_fffffffffffffbb0,
                   (int32)((ulong)in_stack_fffffffffffffba8 >> 0x20));
        break;
      case CPPTYPE_INT64:
        Reflection::GetInt64
                  (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffba8);
        Reflection::SetInt64
                  (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                   (FieldDescriptor *)in_stack_fffffffffffffbb0,(int64)in_stack_fffffffffffffba8);
        break;
      case CPPTYPE_UINT32:
        Reflection::GetUInt32
                  (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffba8);
        Reflection::SetUInt32
                  (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                   (FieldDescriptor *)in_stack_fffffffffffffbb0,
                   (uint32)((ulong)in_stack_fffffffffffffba8 >> 0x20));
        break;
      case CPPTYPE_UINT64:
        Reflection::GetUInt64
                  (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffba8);
        Reflection::SetUInt64
                  (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                   (FieldDescriptor *)in_stack_fffffffffffffbb0,(uint64)in_stack_fffffffffffffba8);
        break;
      case CPPTYPE_DOUBLE:
        in_stack_fffffffffffffc10 = local_b8;
        in_stack_fffffffffffffc18 = local_10;
        in_stack_fffffffffffffc20 = local_e8;
        in_stack_fffffffffffffc28 =
             (Reflection *)
             Reflection::GetDouble
                       (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                        in_stack_fffffffffffffba8);
        Reflection::SetDouble
                  (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                   (FieldDescriptor *)in_stack_fffffffffffffbb0,(double)in_stack_fffffffffffffba8);
        break;
      case CPPTYPE_FLOAT:
        Reflection::GetFloat
                  (in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffba8);
        Reflection::SetFloat
                  (in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                   (FieldDescriptor *)in_stack_fffffffffffffbb0,
                   (float)((ulong)in_stack_fffffffffffffba8 >> 0x20));
        break;
      case CPPTYPE_BOOL:
        in_stack_fffffffffffffbf8 = local_10;
        in_stack_fffffffffffffc00 = local_e8;
        in_stack_fffffffffffffc0f =
             Reflection::GetBool(in_stack_fffffffffffffbb8,(Message *)in_stack_fffffffffffffbb0,
                                 in_stack_fffffffffffffba8);
        Reflection::SetBool(in_stack_fffffffffffffbc0,(Message *)in_stack_fffffffffffffbb8,
                            (FieldDescriptor *)in_stack_fffffffffffffbb0,
                            SUB81((ulong)in_stack_fffffffffffffba8 >> 0x38,0));
        break;
      case CPPTYPE_ENUM:
        in_stack_fffffffffffffbb8 = local_b8;
        in_stack_fffffffffffffbc0 = local_10;
        in_stack_fffffffffffffbc8 = local_e8;
        in_stack_fffffffffffffbd0 =
             (Reflection *)
             Reflection::GetEnum(in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8,
                                 (FieldDescriptor *)in_stack_fffffffffffffba0);
        Reflection::SetEnum(in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                            (FieldDescriptor *)in_stack_fffffffffffffbc0,
                            (EnumValueDescriptor *)in_stack_fffffffffffffbb8);
        break;
      case CPPTYPE_STRING:
        in_stack_fffffffffffffbd8 = local_b8;
        in_stack_fffffffffffffbe0 = local_10;
        in_stack_fffffffffffffbe8 = local_e8;
        Reflection::GetString_abi_cxx11_
                  (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8,
                   (FieldDescriptor *)in_stack_fffffffffffffbc0);
        Reflection::SetString
                  (in_stack_fffffffffffffc28,(Message *)in_stack_fffffffffffffc20,
                   (FieldDescriptor *)in_stack_fffffffffffffc18,(string *)in_stack_fffffffffffffc10)
        ;
        std::__cxx11::string::~string(local_140);
        break;
      case CPPTYPE_MESSAGE:
        in_stack_fffffffffffffbb0 =
             (Reflection *)
             Reflection::MutableMessage
                       (in_stack_fffffffffffffbe8,(Message *)in_stack_fffffffffffffbe0,
                        (FieldDescriptor *)in_stack_fffffffffffffbd8,
                        (MessageFactory *)in_stack_fffffffffffffbd0);
        in_stack_fffffffffffffba8 =
             (FieldDescriptor *)
             Reflection::GetMessage
                       (in_stack_fffffffffffffbc8,(Message *)in_stack_fffffffffffffbc0,
                        (FieldDescriptor *)in_stack_fffffffffffffbb8,
                        (MessageFactory *)in_stack_fffffffffffffbb0);
        (**(_func_int **)(in_stack_fffffffffffffbb0->descriptor_ + 0x88))
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      }
    }
switchD_0044dadb_default:
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  GOOGLE_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  GOOGLE_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            to_reflection->AddMessage(to, field)->MergeFrom(
                from_reflection->GetRepeatedMessage(from, field, j));
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          to_reflection->MutableMessage(to, field)->MergeFrom(
              from_reflection->GetMessage(from, field));
          break;
      }
    }
  }

  to_reflection->MutableUnknownFields(to)->MergeFrom(
      from_reflection->GetUnknownFields(from));
}